

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_remove_handle(Curl_multi *multi,Curl_easy *data)

{
  curl_socket_t cVar1;
  Curl_easy *curr_data;
  Curl_message *msg;
  connectdata *pcStack_48;
  curl_socket_t s;
  connectdata *c;
  Curl_llist_element *pCStack_38;
  CURLMcode rc;
  Curl_llist_element *e;
  Curl_easy *pCStack_28;
  _Bool premature;
  Curl_easy *easy;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  if ((multi == (Curl_multi *)0x0) || (multi->magic != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((data == (Curl_easy *)0x0) || (data->magic != 0xc0dedbad)) {
    multi_local._4_4_ = CURLM_BAD_EASY_HANDLE;
  }
  else if (data->multi == (Curl_multi *)0x0) {
    multi_local._4_4_ = CURLM_OK;
  }
  else if (data->multi == multi) {
    if ((multi->in_callback & 1U) == 0) {
      e._7_1_ = data->mstate < MSTATE_COMPLETED;
      if ((bool)e._7_1_) {
        multi->num_alive = multi->num_alive + -1;
      }
      pCStack_28 = data;
      easy = data;
      data_local = (Curl_easy *)multi;
      if (((data->conn != (connectdata *)0x0) && (MSTATE_DO < data->mstate)) &&
         (data->mstate < MSTATE_COMPLETED)) {
        Curl_conncontrol(data->conn,2);
      }
      if (easy->conn != (connectdata *)0x0) {
        multi_done(easy,easy->result,(_Bool)(e._7_1_ & 1));
      }
      Curl_expire_clear(easy);
      if ((easy->connect_queue).ptr != (void *)0x0) {
        Curl_llist_remove((Curl_llist *)&(data_local->conn_queue).prev,&easy->connect_queue,
                          (void *)0x0);
      }
      if ((easy->dns).hostcachetype == HCACHE_MULTI) {
        (easy->dns).hostcache = (Curl_hash *)0x0;
        (easy->dns).hostcachetype = HCACHE_NONE;
      }
      Curl_wildcard_dtor(&easy->wildcard);
      Curl_llist_destroy(&(easy->state).timeoutlist,(void *)0x0);
      easy->mstate = MSTATE_COMPLETED;
      singlesocket((Curl_multi *)data_local,pCStack_28);
      Curl_detach_connection(easy);
      if ((((easy->set).connect_only != '\0') && (easy->multi_easy == (Curl_multi *)0x0)) &&
         ((cVar1 = Curl_getconnectinfo(easy,&stack0xffffffffffffffb8), cVar1 != -1 &&
          (pcStack_48 != (connectdata *)0x0)))) {
        Curl_conncache_remove_conn(easy,pcStack_48,true);
        Curl_disconnect(easy,pcStack_48,true);
      }
      if ((easy->state).lastconnect_id != -1) {
        Curl_conncache_foreach(easy,(easy->state).conn_cache,(void *)0x0,close_connect_only);
      }
      (easy->state).conn_cache = (conncache *)0x0;
      easy->multi = (Curl_multi *)0x0;
      for (pCStack_38 = (Curl_llist_element *)(data_local->connect_queue).ptr;
          pCStack_38 != (Curl_llist_element *)0x0; pCStack_38 = pCStack_38->next) {
        if (*(Curl_easy **)((long)pCStack_38->ptr + 0x20) == pCStack_28) {
          Curl_llist_remove((Curl_llist *)&data_local->connect_queue,pCStack_38,(void *)0x0);
          break;
        }
      }
      for (pCStack_38 = (data_local->conn_queue).prev; pCStack_38 != (Curl_llist_element *)0x0;
          pCStack_38 = pCStack_38->next) {
        if ((Curl_easy *)pCStack_38->ptr == easy) {
          Curl_llist_remove((Curl_llist *)&(data_local->conn_queue).prev,pCStack_38,(void *)0x0);
          break;
        }
      }
      if (easy->prev == (Curl_easy *)0x0) {
        data_local->next = easy->next;
      }
      else {
        easy->prev->next = easy->next;
      }
      if (easy->next == (Curl_easy *)0x0) {
        data_local->prev = easy->prev;
      }
      else {
        easy->next->prev = easy->prev;
      }
      *(int *)&data_local->conn = *(int *)&data_local->conn + -1;
      process_pending_handles((Curl_multi *)data_local);
      multi_local._4_4_ = Curl_update_timer((Curl_multi *)data_local);
      if (multi_local._4_4_ == CURLM_OK) {
        multi_local._4_4_ = CURLM_OK;
      }
    }
    else {
      multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
    }
  }
  else {
    multi_local._4_4_ = CURLM_BAD_EASY_HANDLE;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_remove_handle(struct Curl_multi *multi,
                                   struct Curl_easy *data)
{
  struct Curl_easy *easy = data;
  bool premature;
  struct Curl_llist_element *e;
  CURLMcode rc;

  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* Verify that we got a somewhat good easy handle too */
  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  /* Prevent users from trying to remove same easy handle more than once */
  if(!data->multi)
    return CURLM_OK; /* it is already removed so let's say it is fine! */

  /* Prevent users from trying to remove an easy handle from the wrong multi */
  if(data->multi != multi)
    return CURLM_BAD_EASY_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  premature = (data->mstate < MSTATE_COMPLETED) ? TRUE : FALSE;

  /* If the 'state' is not INIT or COMPLETED, we might need to do something
     nice to put the easy_handle in a good known state when this returns. */
  if(premature) {
    /* this handle is "alive" so we need to count down the total number of
       alive connections when this is removed */
    multi->num_alive--;
  }

  if(data->conn &&
     data->mstate > MSTATE_DO &&
     data->mstate < MSTATE_COMPLETED) {
    /* Set connection owner so that the DONE function closes it.  We can
       safely do this here since connection is killed. */
    streamclose(data->conn, "Removed with partial response");
  }

  if(data->conn) {
    /* multi_done() clears the association between the easy handle and the
       connection.

       Note that this ignores the return code simply because there's
       nothing really useful to do with it anyway! */
    (void)multi_done(data, data->result, premature);
  }

  /* The timer must be shut down before data->multi is set to NULL, else the
     timenode will remain in the splay tree after curl_easy_cleanup is
     called. Do it after multi_done() in case that sets another time! */
  Curl_expire_clear(data);

  if(data->connect_queue.ptr)
    /* the handle was in the pending list waiting for an available connection,
       so go ahead and remove it */
    Curl_llist_remove(&multi->pending, &data->connect_queue, NULL);

  if(data->dns.hostcachetype == HCACHE_MULTI) {
    /* stop using the multi handle's DNS cache, *after* the possible
       multi_done() call above */
    data->dns.hostcache = NULL;
    data->dns.hostcachetype = HCACHE_NONE;
  }

  Curl_wildcard_dtor(&data->wildcard);

  /* destroy the timeout list that is held in the easy handle, do this *after*
     multi_done() as that may actually call Curl_expire that uses this */
  Curl_llist_destroy(&data->state.timeoutlist, NULL);

  /* change state without using multistate(), only to make singlesocket() do
     what we want */
  data->mstate = MSTATE_COMPLETED;

  /* This ignores the return code even in case of problems because there's
     nothing more to do about that, here */
  (void)singlesocket(multi, easy); /* to let the application know what sockets
                                      that vanish with this handle */

  /* Remove the association between the connection and the handle */
  Curl_detach_connection(data);

  if(data->set.connect_only && !data->multi_easy) {
    /* This removes a handle that was part the multi interface that used
       CONNECT_ONLY, that connection is now left alive but since this handle
       has bits.close set nothing can use that transfer anymore and it is
       forbidden from reuse. And this easy handle cannot find the connection
       anymore once removed from the multi handle

       Better close the connection here, at once.
    */
    struct connectdata *c;
    curl_socket_t s;
    s = Curl_getconnectinfo(data, &c);
    if((s != CURL_SOCKET_BAD) && c) {
      Curl_conncache_remove_conn(data, c, TRUE);
      Curl_disconnect(data, c, TRUE);
    }
  }

  if(data->state.lastconnect_id != -1) {
    /* Mark any connect-only connection for closure */
    Curl_conncache_foreach(data, data->state.conn_cache,
                           NULL, close_connect_only);
  }

#ifdef USE_LIBPSL
  /* Remove the PSL association. */
  if(data->psl == &multi->psl)
    data->psl = NULL;
#endif

  /* as this was using a shared connection cache we clear the pointer to that
     since we're not part of that multi handle anymore */
  data->state.conn_cache = NULL;

  data->multi = NULL; /* clear the association to this multi handle */

  /* make sure there's no pending message in the queue sent from this easy
     handle */

  for(e = multi->msglist.head; e; e = e->next) {
    struct Curl_message *msg = e->ptr;

    if(msg->extmsg.easy_handle == easy) {
      Curl_llist_remove(&multi->msglist, e, NULL);
      /* there can only be one from this specific handle */
      break;
    }
  }

  /* Remove from the pending list if it is there. Otherwise this will
     remain on the pending list forever due to the state change. */
  for(e = multi->pending.head; e; e = e->next) {
    struct Curl_easy *curr_data = e->ptr;

    if(curr_data == data) {
      Curl_llist_remove(&multi->pending, e, NULL);
      break;
    }
  }

  /* make the previous node point to our next */
  if(data->prev)
    data->prev->next = data->next;
  else
    multi->easyp = data->next; /* point to first node */

  /* make our next point to our previous node */
  if(data->next)
    data->next->prev = data->prev;
  else
    multi->easylp = data->prev; /* point to last node */

  /* NOTE NOTE NOTE
     We do not touch the easy handle here! */
  multi->num_easy--; /* one less to care about now */

  process_pending_handles(multi);

  rc = Curl_update_timer(multi);
  if(rc)
    return rc;
  return CURLM_OK;
}